

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int dupedExprNodeSize(Expr *p,int flags)

{
  size_t sVar1;
  uint local_18;
  int nByte;
  int flags_local;
  Expr *p_local;
  
  local_18 = dupedExprStructSize(p,flags);
  local_18 = local_18 & 0xfff;
  if (((p->flags & 0x400) == 0) && ((p->u).zToken != (char *)0x0)) {
    sVar1 = strlen((p->u).zToken);
    local_18 = local_18 + ((uint)sVar1 & 0x3fffffff) + 1;
  }
  return local_18 + 7 & 0xfffffff8;
}

Assistant:

static int dupedExprNodeSize(Expr *p, int flags){
  int nByte = dupedExprStructSize(p, flags) & 0xfff;
  if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
    nByte += sqlite3Strlen30NN(p->u.zToken)+1;
  }
  return ROUND8(nByte);
}